

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_helper-inl.h
# Opt level: O3

int __thiscall spdlog::details::file_helper::open(file_helper *this,char *__file,int __oflag,...)

{
  filename_t *pfVar1;
  pointer pcVar2;
  int iVar3;
  long lVar4;
  FILE *pFVar5;
  FILE *pFVar6;
  FILE *extraout_RAX;
  ulong uVar7;
  int *piVar8;
  long *plVar9;
  int iVar10;
  FILE *pFVar11;
  undefined1 local_a0 [36];
  int local_7c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pFVar11 = (FILE *)this->fd_;
  local_7c = __oflag;
  if (pFVar11 != (FILE *)0x0) {
    if ((this->event_handlers_).before_close.super__Function_base._M_manager != (_Manager_type)0x0)
    {
      local_a0._0_8_ = pFVar11;
      (*(this->event_handlers_).before_close._M_invoker)
                ((_Any_data *)&(this->event_handlers_).before_close,&this->filename_,
                 (_IO_FILE **)local_a0);
      pFVar11 = (FILE *)this->fd_;
    }
    fclose(pFVar11);
    this->fd_ = (FILE *)0x0;
    if ((this->event_handlers_).after_close.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*(this->event_handlers_).after_close._M_invoker)
                ((_Any_data *)&(this->event_handlers_).after_close,&this->filename_);
    }
  }
  pfVar1 = &this->filename_;
  std::__cxx11::string::_M_assign((string *)pfVar1);
  if ((this->event_handlers_).before_open.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->event_handlers_).before_open._M_invoker)((_Any_data *)&this->event_handlers_,pfVar1);
  }
  pFVar11 = (FILE *)(local_a0 + 0x10);
  local_78 = pfVar1;
  if (0 < this->open_tries_) {
    iVar10 = 0;
    do {
      lVar4 = std::__cxx11::string::find_last_of(__file,0x1cba80,0xffffffffffffffff);
      if (lVar4 == -1) {
        local_a0._8_8_ = 0;
        local_a0._16_8_ = local_a0._16_8_ & 0xffffffffffffff00;
        local_a0._0_8_ = pFVar11;
      }
      else {
        std::__cxx11::string::substr((ulong)local_a0,(ulong)__file);
      }
      os::create_dir((filename_t *)local_a0);
      if ((FILE *)local_a0._0_8_ != pFVar11) {
        operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
      }
      if ((char)local_7c == '\0') {
LAB_0018629f:
        local_a0._0_8_ = pFVar11;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"ab","");
        pFVar6 = fopen(*(char **)__file,(char *)local_a0._0_8_);
        this->fd_ = (FILE *)pFVar6;
        pFVar5 = pFVar6;
        if ((FILE *)local_a0._0_8_ != pFVar11) {
          operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
          pFVar5 = extraout_RAX;
        }
        iVar3 = (int)pFVar5;
        if (pFVar6 != (FILE *)0x0) {
          if ((this->event_handlers_).after_open.super__Function_base._M_manager !=
              (_Manager_type)0x0) {
            local_a0._0_8_ = this->fd_;
            iVar3 = (*(this->event_handlers_).after_open._M_invoker)
                              ((_Any_data *)&(this->event_handlers_).after_open,local_78,
                               (_IO_FILE **)local_a0);
          }
          return iVar3;
        }
        uVar7 = (ulong)this->open_interval_;
        if (uVar7 != 0) {
          local_a0._0_8_ = uVar7 / 1000;
          local_a0._8_8_ = (uVar7 % 1000) * 1000000;
          do {
            iVar3 = nanosleep((timespec *)local_a0,(timespec *)local_a0);
            if (iVar3 != -1) break;
            piVar8 = __errno_location();
          } while (*piVar8 == 4);
        }
      }
      else {
        local_a0._0_8_ = pFVar11;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"wb","");
        pFVar5 = fopen(*(char **)__file,(char *)local_a0._0_8_);
        if ((FILE *)local_a0._0_8_ != pFVar11) {
          operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
        }
        if (pFVar5 != (FILE *)0x0) {
          fclose(pFVar5);
          goto LAB_0018629f;
        }
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 < this->open_tries_);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  pcVar2 = (this->filename_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar2,pcVar2 + (this->filename_)._M_string_length);
  std::operator+(&local_50,"Failed opening file ",&local_70);
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_a0._0_8_ = *plVar9;
  pFVar5 = (FILE *)(plVar9 + 2);
  if ((FILE *)local_a0._0_8_ == pFVar5) {
    local_a0._16_8_ = *(undefined8 *)pFVar5;
    local_a0._24_8_ = plVar9[3];
    local_a0._0_8_ = pFVar11;
  }
  else {
    local_a0._16_8_ = *(undefined8 *)pFVar5;
  }
  local_a0._8_8_ = plVar9[1];
  *plVar9 = (long)pFVar5;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  piVar8 = __errno_location();
  throw_spdlog_ex((string *)local_a0,*piVar8);
}

Assistant:

SPDLOG_INLINE void file_helper::open(const filename_t &fname, bool truncate) {
    close();
    filename_ = fname;

    auto *mode = SPDLOG_FILENAME_T("ab");
    auto *trunc_mode = SPDLOG_FILENAME_T("wb");

    if (event_handlers_.before_open) {
        event_handlers_.before_open(filename_);
    }
    for (int tries = 0; tries < open_tries_; ++tries) {
        // create containing folder if not exists already.
        os::create_dir(os::dir_name(fname));
        if (truncate) {
            // Truncate by opening-and-closing a tmp file in "wb" mode, always
            // opening the actual log-we-write-to in "ab" mode, since that
            // interacts more politely with eternal processes that might
            // rotate/truncate the file underneath us.
            std::FILE *tmp;
            if (os::fopen_s(&tmp, fname, trunc_mode)) {
                continue;
            }
            std::fclose(tmp);
        }
        if (!os::fopen_s(&fd_, fname, mode)) {
            if (event_handlers_.after_open) {
                event_handlers_.after_open(filename_, fd_);
            }
            return;
        }

        details::os::sleep_for_millis(open_interval_);
    }

    throw_spdlog_ex("Failed opening file " + os::filename_to_str(filename_) + " for writing",
                    errno);
}